

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int handle_handshake_record
              (ptls_t *tls,
              _func_int_ptls_t_ptr_ptls_message_emitter_t_ptr_ptls_iovec_t_int_ptls_handshake_properties_t_ptr
              *cb,ptls_message_emitter_t *emitter,st_ptls_record_t *rec,
              ptls_handshake_properties_t *properties)

{
  uint32_t uVar1;
  int iVar2;
  ulong len;
  size_t size;
  char *in_RCX;
  ptls_buffer_t *in_RDX;
  ptls_buffer_t *in_RSI;
  undefined8 *in_RDI;
  undefined8 in_R8;
  size_t new_size;
  size_t mess_len;
  uint8_t *src_end;
  uint8_t *src;
  int ret;
  undefined8 *in_stack_ffffffffffffff78;
  ptls_buffer_t *in_stack_ffffffffffffff80;
  ptls_buffer_t *in_stack_ffffffffffffff88;
  ptls_buffer_t *buf;
  ptls_iovec_t local_60;
  size_t sStack_58;
  void *local_48;
  void *local_40;
  int local_34;
  
  if (*in_RCX != '\x16') {
    return 0x32;
  }
  if (in_RDI[6] == 0) {
    local_40 = *(void **)(in_RCX + 0x10);
    local_48 = (void *)((long)local_40 + *(long *)(in_RCX + 8));
  }
  else {
    iVar2 = message_buffer_is_overflow((ptls_context_t *)*in_RDI,in_RDI[8] + *(long *)(in_RCX + 8));
    if (iVar2 != 0) {
      return 0x28;
    }
    iVar2 = ptls_buffer_reserve(in_stack_ffffffffffffff88,(size_t)in_stack_ffffffffffffff80);
    if (iVar2 != 0) {
      return iVar2;
    }
    memcpy((void *)(in_RDI[6] + in_RDI[8]),*(void **)(in_RCX + 0x10),*(size_t *)(in_RCX + 8));
    in_RDI[8] = *(long *)(in_RCX + 8) + in_RDI[8];
    local_40 = (void *)in_RDI[6];
    local_48 = (void *)((long)local_40 + in_RDI[8]);
  }
  local_34 = 0x202;
  for (; 3 < (long)local_48 - (long)local_40; local_40 = (void *)(len + (long)local_40)) {
    uVar1 = ntoh24((uint8_t *)((long)local_40 + 1));
    len = (ulong)(uVar1 + 4);
    if ((long)local_48 - (long)local_40 < (long)(int)(uVar1 + 4)) break;
    in_stack_ffffffffffffff78 = in_RDI;
    in_stack_ffffffffffffff80 = in_RDX;
    in_stack_ffffffffffffff88 = in_RSI;
    local_60 = ptls_iovec_init(local_40,len);
    local_34 = (*(code *)in_stack_ffffffffffffff88)
                         (in_stack_ffffffffffffff78,in_stack_ffffffffffffff80,buf,sStack_58,
                          (long)local_48 - (long)local_40 == len,in_R8);
    if ((local_34 != 0) && (local_34 != 0x202)) {
      ptls_buffer_dispose(buf);
      return local_34;
    }
  }
  if (local_40 == local_48) {
    ptls_buffer_dispose(buf);
  }
  else {
    size = (long)local_48 - (long)local_40;
    iVar2 = message_buffer_is_overflow((ptls_context_t *)*in_RDI,size);
    if (iVar2 != 0) {
      return 0x28;
    }
    if (in_RDI[6] == 0) {
      ptls_buffer_init(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,0x113d2a);
      iVar2 = ptls_buffer_reserve(in_stack_ffffffffffffff88,(size_t)in_stack_ffffffffffffff80);
      if (iVar2 != 0) {
        return iVar2;
      }
      memcpy((void *)in_RDI[6],local_40,size);
    }
    else {
      memmove((void *)in_RDI[6],local_40,size);
    }
    in_RDI[8] = size;
    local_34 = 0x202;
  }
  return local_34;
}

Assistant:

static int handle_handshake_record(ptls_t *tls,
                                   int (*cb)(ptls_t *tls, ptls_message_emitter_t *emitter, ptls_iovec_t message,
                                             int is_end_of_record, ptls_handshake_properties_t *properties),
                                   ptls_message_emitter_t *emitter, struct st_ptls_record_t *rec,
                                   ptls_handshake_properties_t *properties)
{
    int ret;

    /* handshake */
    if (rec->type != PTLS_CONTENT_TYPE_HANDSHAKE)
        return PTLS_ALERT_DECODE_ERROR;

    /* flatten the unhandled messages */
    const uint8_t *src, *src_end;
    if (tls->recvbuf.mess.base == NULL) {
        src = rec->fragment;
        src_end = src + rec->length;
    } else {
        if (message_buffer_is_overflow(tls->ctx, tls->recvbuf.mess.off + rec->length))
            return PTLS_ALERT_HANDSHAKE_FAILURE;
        if ((ret = ptls_buffer_reserve(&tls->recvbuf.mess, rec->length)) != 0)
            return ret;
        memcpy(tls->recvbuf.mess.base + tls->recvbuf.mess.off, rec->fragment, rec->length);
        tls->recvbuf.mess.off += rec->length;
        src = tls->recvbuf.mess.base;
        src_end = src + tls->recvbuf.mess.off;
    }

    /* handle the messages */
    ret = PTLS_ERROR_IN_PROGRESS;
    while (src_end - src >= 4) {
        size_t mess_len = 4 + ntoh24(src + 1);
        if (src_end - src < (int)mess_len)
            break;
        ret = cb(tls, emitter, ptls_iovec_init(src, mess_len), src_end - src == mess_len, properties);
        switch (ret) {
        case 0:
        case PTLS_ERROR_IN_PROGRESS:
            break;
        default:
            ptls_buffer_dispose(&tls->recvbuf.mess);
            return ret;
        }
        src += mess_len;
    }

    /* keep last partial message in buffer */
    if (src != src_end) {
        size_t new_size = src_end - src;
        if (message_buffer_is_overflow(tls->ctx, new_size))
            return PTLS_ALERT_HANDSHAKE_FAILURE;
        if (tls->recvbuf.mess.base == NULL) {
            ptls_buffer_init(&tls->recvbuf.mess, "", 0);
            if ((ret = ptls_buffer_reserve(&tls->recvbuf.mess, new_size)) != 0)
                return ret;
            memcpy(tls->recvbuf.mess.base, src, new_size);
        } else {
            memmove(tls->recvbuf.mess.base, src, new_size);
        }
        tls->recvbuf.mess.off = new_size;
        ret = PTLS_ERROR_IN_PROGRESS;
    } else {
        ptls_buffer_dispose(&tls->recvbuf.mess);
    }

    return ret;
}